

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void xy_y_convolve_4tap_16x2_avx2
               (int16_t *src,__m256i *s_256,__m256i *ss_256,__m256i *tt_256,__m256i *coeffs,
               __m256i *r)

{
  undefined1 auVar1 [32];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  __m256i *in_stack_fffffffffffffe80;
  __m256i *in_stack_fffffffffffffe88;
  
  uVar2 = *(undefined8 *)(in_RDI + 0x68);
  uVar3 = *(undefined8 *)(in_RDI + 0x70);
  uVar4 = *(undefined8 *)(in_RDI + 0x78);
  *(undefined8 *)(in_RSI + 0x60) = *(undefined8 *)(in_RDI + 0x60);
  *(undefined8 *)(in_RSI + 0x68) = uVar2;
  *(undefined8 *)(in_RSI + 0x70) = uVar3;
  *(undefined8 *)(in_RSI + 0x78) = uVar4;
  auVar1 = vpunpcklwd_avx2(*(undefined1 (*) [32])(in_RSI + 0x40),
                           *(undefined1 (*) [32])(in_RSI + 0x60));
  *(undefined1 (*) [32])(in_RDX + 4) = auVar1;
  auVar1 = vpunpckhwd_avx2(*(undefined1 (*) [32])(in_RSI + 0x40),
                           *(undefined1 (*) [32])(in_RSI + 0x60));
  *(undefined1 (*) [32])(in_RDX + 0xc) = auVar1;
  uVar2 = *(undefined8 *)(in_RDI + 0x88);
  uVar3 = *(undefined8 *)(in_RDI + 0x90);
  uVar4 = *(undefined8 *)(in_RDI + 0x98);
  *(undefined8 *)(in_RSI + 0x40) = *(undefined8 *)(in_RDI + 0x80);
  *(undefined8 *)(in_RSI + 0x48) = uVar2;
  *(undefined8 *)(in_RSI + 0x50) = uVar3;
  *(undefined8 *)(in_RSI + 0x58) = uVar4;
  auVar1 = vpunpcklwd_avx2(*(undefined1 (*) [32])(in_RSI + 0x60),
                           *(undefined1 (*) [32])(in_RSI + 0x40));
  *(undefined1 (*) [32])(in_RCX + 4) = auVar1;
  auVar1 = vpunpckhwd_avx2(*(undefined1 (*) [32])(in_RSI + 0x60),
                           *(undefined1 (*) [32])(in_RSI + 0x40));
  *(undefined1 (*) [32])(in_RCX + 0xc) = auVar1;
  xy_y_convolve_4tap_16_avx2
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,(__m256i *)0x9a69da);
  xy_y_convolve_4tap_16_avx2
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,(__m256i *)0x9a69f2);
  *in_RDX = in_RDX[4];
  in_RDX[1] = in_RDX[5];
  in_RDX[2] = in_RDX[6];
  in_RDX[3] = in_RDX[7];
  in_RDX[8] = in_RDX[0xc];
  in_RDX[9] = in_RDX[0xd];
  in_RDX[10] = in_RDX[0xe];
  in_RDX[0xb] = in_RDX[0xf];
  *in_RCX = in_RCX[4];
  in_RCX[1] = in_RCX[5];
  in_RCX[2] = in_RCX[6];
  in_RCX[3] = in_RCX[7];
  in_RCX[8] = in_RCX[0xc];
  in_RCX[9] = in_RCX[0xd];
  in_RCX[10] = in_RCX[0xe];
  in_RCX[0xb] = in_RCX[0xf];
  return;
}

Assistant:

static inline void xy_y_convolve_4tap_16x2_avx2(
    const int16_t *const src, __m256i s_256[4], __m256i ss_256[4],
    __m256i tt_256[4], const __m256i coeffs[2], __m256i r[4]) {
  s_256[3] = _mm256_loadu_si256((__m256i *)(src + 3 * 16));
  ss_256[1] = _mm256_unpacklo_epi16(s_256[2], s_256[3]);
  ss_256[3] = _mm256_unpackhi_epi16(s_256[2], s_256[3]);
  s_256[2] = _mm256_loadu_si256((__m256i *)(src + 4 * 16));
  tt_256[1] = _mm256_unpacklo_epi16(s_256[3], s_256[2]);
  tt_256[3] = _mm256_unpackhi_epi16(s_256[3], s_256[2]);
  xy_y_convolve_4tap_16_avx2(ss_256, coeffs, r + 0);
  xy_y_convolve_4tap_16_avx2(tt_256, coeffs, r + 2);
  ss_256[0] = ss_256[1];
  ss_256[2] = ss_256[3];
  tt_256[0] = tt_256[1];
  tt_256[2] = tt_256[3];
}